

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_tests.cpp
# Opt level: O2

void __thiscall omp_zip_val_types_Test::TestBody(omp_zip_val_types_Test *this)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  allocator_type local_e9;
  vector<int,_std::allocator<int>_> initial2;
  _Vector_base<int,_std::allocator<int>_> local_c8;
  AssertionResult gtest_ar_;
  _Vector_base<int,_std::allocator<int>_> local_a0;
  _Vector_base<int,_std::allocator<int>_> local_88;
  vector<int,_std::allocator<int>_> initial1;
  zip<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
  result;
  
  result.containers_.
  super__Tuple_impl<0UL,_const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
  .
  super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
  .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
  super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x200000001;
  result.containers_.
  super__Tuple_impl<0UL,_const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
  .
  super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
  .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
  super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x400000003;
  result.containers_.
  super__Tuple_impl<0UL,_const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
  .
  super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
  .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
  super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage.
  _0_4_ = 5;
  __l._M_len = 5;
  __l._M_array = (iterator)&result;
  std::vector<int,_std::allocator<int>_>::vector(&initial1,__l,(allocator_type *)&initial2);
  result.containers_.
  super__Tuple_impl<0UL,_const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
  .
  super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
  .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
  super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x700000006;
  result.containers_.
  super__Tuple_impl<0UL,_const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
  .
  super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
  .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
  super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x900000008;
  result.containers_.
  super__Tuple_impl<0UL,_const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
  .
  super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
  .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
  super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage.
  _0_4_ = 0;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&result;
  std::vector<int,_std::allocator<int>_>::vector(&initial2,__l_00,(allocator_type *)&gtest_ar_);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_88,&initial1);
  local_c8._M_impl.super__Vector_impl_data._M_start =
       initial2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_c8._M_impl.super__Vector_impl_data._M_finish =
       initial2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage =
       initial2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  initial2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  initial2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  initial2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  gtest_ar_.success_ = true;
  gtest_ar_._1_7_ = 0x2000000;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 3;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&gtest_ar_;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_a0,__l_01,&local_e9);
  std::
  _Tuple_impl<0ul,std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
  ::
  _Tuple_impl<std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,void>
            ((_Tuple_impl<0ul,std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
              *)&result,(vector<int,_std::allocator<int>_> *)&local_88,
             (vector<int,_std::allocator<int>_> *)&local_c8,
             (vector<int,_std::allocator<int>_> *)&local_a0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_a0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_c8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
  gtest_ar_.success_ = true;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::
  _Tuple_impl<0UL,_const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
                  *)&result);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&initial2.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&initial1.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

TEST(omp_zip, val_types) {
  const std::vector initial1 = {1, 2, 3, 4, 5};
  std::vector initial2 = {6, 7, 8, 9, 0};

  auto result = omp::zip(std::move(initial1), std::move(initial2),
                         std::vector<int>{1, 2, 3});

  auto f_is_const_val = std::is_same_v<
      std::add_const_t<decltype(initial1)>,
      std::tuple_element_t<0, std::decay_t<decltype(result.containers())>>>;

  auto s_is_val = std::is_same_v<
      decltype(initial2),
      std::tuple_element_t<1, std::decay_t<decltype(result.containers())>>>;

  auto t_is_val = std::is_same_v<
      std::vector<int>,
      std::tuple_element_t<2, std::decay_t<decltype(result.containers())>>>;

  ASSERT_TRUE(f_is_const_val && s_is_val && t_is_val);
}